

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::add(Solver *this,ClauseRep *c,bool isNew)

{
  bool bVar1;
  ImpType t;
  uint size;
  ConstraintType CVar2;
  uint uVar3;
  LitVec *this_00;
  byte in_DL;
  ConstraintInfo *in_RSI;
  Solver *in_RDI;
  Result RVar4;
  uint32 ts;
  Literal u;
  int added;
  SolverStats *pSVar5;
  ConstraintType in_stack_ffffffffffffff64;
  SharedContext *lits;
  Solver *in_stack_ffffffffffffff78;
  SharedContext *this_01;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  ClauseHead *local_58;
  Status in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Literal *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Result local_30;
  byte local_19;
  ConstraintInfo *local_18;
  bool local_1;
  
  local_19 = in_DL & 1;
  if ((int)in_RSI[1].super_ConstraintScore.rep < 0) {
    local_18 = in_RSI;
    if ((in_RSI[1].super_ConstraintScore.rep & 0x7fffffff) < 2) {
      if ((in_RSI[1].super_ConstraintScore.rep & 0x7fffffff) == 0) {
        lit_false();
      }
      trail(in_RDI);
      in_stack_ffffffffffffff64 =
           sizeVec<bk_lib::pod_vector<Clasp::Literal,std::allocator<Clasp::Literal>>>
                     ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1e7f06);
      force(in_stack_ffffffffffffff78,(Literal)(uint32)((ulong)in_RDI >> 0x20));
      this_00 = trail(in_RDI);
      CVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(this_00);
      size = (uint)(in_stack_ffffffffffffff64 != CVar2);
    }
    else {
      bVar1 = allowImplicit(in_RDI,(ClauseRep *)in_stack_ffffffffffffff78);
      if (!bVar1) {
        RVar4 = ClauseCreator::create
                          ((Solver *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (ClauseRep *)
                           CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           (uint32)((ulong)in_RDI >> 0x20));
        local_58 = RVar4.local;
        bVar1 = ClauseCreator::Result::ok((Result *)&local_58);
        return bVar1;
      }
      lits = in_RDI->shared_;
      t = local_18[1].super_ConstraintScore.rep & 0x7fffffff;
      this_01 = *(SharedContext **)(local_18 + 2);
      ConstraintInfo::type(local_18);
      size = SharedContext::addImp(this_01,t,(Literal *)lits,in_stack_ffffffffffffff64);
    }
    if (((0 < (int)size) && ((local_19 & 1) != 0)) &&
       (bVar1 = ConstraintInfo::learnt((ConstraintInfo *)0x1e7f70), bVar1)) {
      pSVar5 = &in_RDI->stats;
      uVar3 = local_18[1].super_ConstraintScore.rep & 0x7fffffff;
      ConstraintInfo::type(local_18);
      SolverStats::addLearnt
                ((SolverStats *)CONCAT44(in_stack_ffffffffffffff64,uVar3),
                 (uint32)((ulong)pSVar5 >> 0x20),(ConstraintType)pSVar5);
      distribute((Solver *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc0,size,
                 (ConstraintInfo *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    bVar1 = hasConflict((Solver *)0x1e7fec);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    RVar4 = ClauseCreator::create
                      ((Solver *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (ClauseRep *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (uint32)((ulong)in_RDI >> 0x20));
    local_30.local = RVar4.local;
    local_30.status = RVar4.status;
    local_1 = ClauseCreator::Result::ok(&local_30);
  }
  return local_1;
}

Assistant:

bool Solver::add(const ClauseRep& c, bool isNew) {
	typedef ShortImplicationsGraph::ImpType ImpType;
	if (c.prep == 0) {
		return ClauseCreator::create(*this, c, ClauseCreator::clause_force_simplify).ok();
	}
	int added = 0;
	if (c.size > 1) {
		if (allowImplicit(c)) { added = shared_->addImp(static_cast<ImpType>(c.size), c.lits, c.info.type()); }
		else                  { return ClauseCreator::create(*this, c, ClauseCreator::clause_explicit).ok(); }
	}
	else {
		Literal u = c.size ? c.lits[0] : lit_false();
		uint32  ts= sizeVec(trail());
		force(u);
		added     = int(ts != trail().size());
	}
	if (added > 0 && isNew && c.info.learnt()) {
		stats.addLearnt(c.size, c.info.type());
		distribute(c.lits, c.size, c.info);
	}
	return !hasConflict();
}